

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSP.hpp
# Opt level: O1

void __thiscall Tour::printTour(Tour *this)

{
  int *__k;
  int iVar1;
  mapped_type *pmVar2;
  ostream *poVar3;
  long *plVar4;
  int prev_node;
  int next_node;
  int local_38;
  int local_34;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Forward Traversal",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  __k = &this->head_node_;
  pmVar2 = std::__detail::
           _Map_base<int,_std::pair<const_int,_NodeWrapper>,_std::allocator<std::pair<const_int,_NodeWrapper>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_NodeWrapper>,_std::allocator<std::pair<const_int,_NodeWrapper>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this,__k);
  local_34 = pmVar2->next_idx_;
  pmVar2 = std::__detail::
           _Map_base<int,_std::pair<const_int,_NodeWrapper>,_std::allocator<std::pair<const_int,_NodeWrapper>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_NodeWrapper>,_std::allocator<std::pair<const_int,_NodeWrapper>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this,__k);
  local_38 = pmVar2->prev_idx_;
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->head_node_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"-->",3);
  iVar1 = this->head_node_;
  if (local_34 != iVar1) {
    do {
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_34);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"-->",3);
      pmVar2 = std::__detail::
               _Map_base<int,_std::pair<const_int,_NodeWrapper>,_std::allocator<std::pair<const_int,_NodeWrapper>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_NodeWrapper>,_std::allocator<std::pair<const_int,_NodeWrapper>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this,&local_34);
      local_34 = pmVar2->next_idx_;
      iVar1 = this->head_node_;
    } while (local_34 != iVar1);
  }
  plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Back Traversal",0xe);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*__k);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"<--",3);
  iVar1 = *__k;
  if (local_38 != iVar1) {
    do {
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_38);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"<--",3);
      pmVar2 = std::__detail::
               _Map_base<int,_std::pair<const_int,_NodeWrapper>,_std::allocator<std::pair<const_int,_NodeWrapper>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_NodeWrapper>,_std::allocator<std::pair<const_int,_NodeWrapper>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this,&local_38);
      local_38 = pmVar2->prev_idx_;
      iVar1 = this->head_node_;
    } while (local_38 != iVar1);
  }
  plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  return;
}

Assistant:

void printTour()
    {
        PRINTN("Forward Traversal")
        int next_node = tour_map_[head_node_].next_idx_;
        int prev_node = tour_map_[head_node_].prev_idx_;
        PRINT(head_node_ << "-->")
        while(next_node != head_node_)
        {
            PRINT(next_node << "-->")
            next_node = tour_map_[next_node].next_idx_;
        }
        PRINTN(head_node_)
        
        PRINTN("Back Traversal")
        PRINT(head_node_ << "<--")
        while(prev_node != head_node_)
        {
            PRINT(prev_node << "<--")
            prev_node = tour_map_[prev_node].prev_idx_;
        }
         PRINTN(head_node_)

    }